

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O0

int CfdVerifySignature(void *handle,int net_type,char *tx_hex,char *signature,int hash_type,
                      char *pubkey,char *script,char *txid,uint32_t vout,int sighash_type,
                      bool sighash_anyone_can_pay,int64_t value_satoshi,char *value_bytedata)

{
  bool bVar1;
  undefined1 uVar2;
  undefined8 uVar3;
  char *in_RCX;
  Amount *in_RDX;
  ByteData *in_R9;
  OutPoint *in_stack_00000008;
  char *in_stack_00000010;
  uint32_t in_stack_00000018;
  uint8_t in_stack_00000020;
  byte in_stack_00000028;
  int64_t in_stack_00000030;
  char *in_stack_00000038;
  CfdException *except;
  exception *std_except;
  ConfidentialTransactionContext tx_1;
  ConfidentialValue value;
  TransactionContext tx;
  bool is_bitcoin;
  bool is_verify;
  ByteData signature_obj;
  SigHashType sighashtype;
  OutPoint outpoint;
  Amount amount;
  WitnessVersion version;
  string *in_stack_fffffffffffff878;
  WitnessVersion in_stack_fffffffffffff880;
  undefined4 in_stack_fffffffffffff884;
  string *in_stack_fffffffffffff890;
  CfdError in_stack_fffffffffffff89c;
  undefined7 in_stack_fffffffffffff8a0;
  undefined1 in_stack_fffffffffffff8a7;
  bool *in_stack_fffffffffffff8d8;
  allocator *paVar4;
  int in_stack_fffffffffffff8e4;
  ConfidentialValue *in_stack_fffffffffffff918;
  Amount *value_00;
  undefined6 in_stack_fffffffffffff920;
  undefined1 in_stack_fffffffffffff926;
  undefined1 in_stack_fffffffffffff927;
  OutPoint *in_stack_fffffffffffff928;
  Pubkey *in_stack_fffffffffffff930;
  ByteData *in_stack_fffffffffffff938;
  ConfidentialTransactionContext *in_stack_fffffffffffff940;
  TransactionContext *this;
  ConfidentialValue *in_stack_fffffffffffff950;
  WitnessVersion in_stack_fffffffffffff958;
  WitnessVersion WVar5;
  SigHashType local_618;
  allocator local_609;
  string local_608;
  Pubkey local_5e8;
  SigHashType local_5d0;
  allocator local_5c1;
  string local_5c0;
  Script local_5a0;
  allocator local_561;
  string local_560;
  Pubkey local_540;
  allocator local_521;
  string local_520 [216];
  ConfidentialValue local_448;
  allocator local_419;
  string local_418;
  ConfidentialValue local_3f8;
  ConfidentialValue local_3d0;
  SigHashType local_3a8;
  Amount local_399 [2];
  Pubkey local_378;
  SigHashType local_360;
  allocator local_351;
  string local_350;
  Script local_330;
  TransactionContext local_2f1;
  byte local_1d3;
  byte local_1d2;
  allocator local_1d1;
  string local_1d0;
  ByteData local_1b0;
  SigHashType local_198;
  allocator local_189;
  string local_188;
  Txid local_168;
  OutPoint local_148;
  Amount local_120;
  WitnessVersion local_110;
  undefined1 local_10a;
  allocator local_109;
  string local_108 [32];
  CfdSourceLocation local_e8;
  undefined1 local_ca;
  allocator local_c9;
  string local_c8 [32];
  CfdSourceLocation local_a8;
  undefined1 local_8a;
  allocator local_89;
  string local_88 [32];
  CfdSourceLocation local_68;
  byte local_39;
  ByteData *local_38;
  char *local_28;
  Amount *local_20;
  int local_4;
  
  local_39 = in_stack_00000028 & 1;
  local_38 = in_R9;
  local_28 = in_RCX;
  local_20 = in_RDX;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString((char *)local_20);
  if (bVar1) {
    local_68.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
                 ,0x2f);
    local_68.filename = local_68.filename + 1;
    local_68.line = 0x851;
    local_68.funcname = "CfdVerifySignature";
    cfd::core::logger::warn<>(&local_68,"tx is null or empty.");
    local_8a = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,"Failed to parameter. tx is null or empty.",&local_89);
    cfd::core::CfdException::CfdException
              ((CfdException *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
               in_stack_fffffffffffff89c,in_stack_fffffffffffff890);
    local_8a = 0;
    __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(local_28);
  if (bVar1) {
    local_a8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
                 ,0x2f);
    local_a8.filename = local_a8.filename + 1;
    local_a8.line = 0x857;
    local_a8.funcname = "CfdVerifySignature";
    cfd::core::logger::warn<>(&local_a8,"signature is null or empty.");
    local_ca = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_c8,"Failed to parameter. signature is null or empty.",&local_c9);
    cfd::core::CfdException::CfdException
              ((CfdException *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
               in_stack_fffffffffffff89c,in_stack_fffffffffffff890);
    local_ca = 0;
    __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString((char *)local_38);
  if (bVar1) {
    local_e8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
                 ,0x2f);
    local_e8.filename = local_e8.filename + 1;
    local_e8.line = 0x85d;
    local_e8.funcname = "CfdVerifySignature";
    cfd::core::logger::warn<>(&local_e8,"pubkey is null or empty.");
    local_10a = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_108,"Failed to parameter. pubkey is null or empty.",&local_109);
    cfd::core::CfdException::CfdException
              ((CfdException *)CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
               in_stack_fffffffffffff89c,in_stack_fffffffffffff890);
    local_10a = 0;
    __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_110 = cfd::capi::GetWitnessVersion(in_stack_fffffffffffff8e4);
  cfd::core::Amount::Amount(&local_120,in_stack_00000030);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_188,in_stack_00000010,&local_189);
  cfd::core::Txid::Txid(&local_168,&local_188);
  cfd::core::OutPoint::OutPoint(&local_148,&local_168,in_stack_00000018);
  cfd::core::Txid::~Txid((Txid *)0x61c215);
  std::__cxx11::string::~string((string *)&local_188);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  cfd::core::SigHashType::Create(&local_198,in_stack_00000020,(bool)(local_39 & 1),false);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1d0,local_28,&local_1d1);
  cfd::core::ByteData::ByteData(&local_1b0,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  local_1d2 = 0;
  local_1d3 = 0;
  cfd::capi::ConvertNetType(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8d8);
  if ((local_1d3 & 1) == 0) {
    cfd::core::ConfidentialValue::ConfidentialValue(&local_3d0);
    bVar1 = cfd::capi::IsEmptyString(in_stack_00000038);
    if (bVar1) {
      cfd::core::ConfidentialValue::ConfidentialValue(&local_448,&local_120);
      cfd::core::ConfidentialValue::operator=(&local_3d0,&local_448);
      cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x61ca68);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_418,in_stack_00000038,&local_419);
      cfd::core::ConfidentialValue::ConfidentialValue(&local_3f8,&local_418);
      cfd::core::ConfidentialValue::operator=(&local_3d0,&local_3f8);
      cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x61c989);
      std::__cxx11::string::~string((string *)&local_418);
      std::allocator<char>::~allocator((allocator<char> *)&local_419);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_520,(char *)local_20,&local_521);
    cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
              ((ConfidentialTransactionContext *)
               CONCAT44(in_stack_fffffffffffff884,in_stack_fffffffffffff880),
               in_stack_fffffffffffff878);
    std::__cxx11::string::~string(local_520);
    std::allocator<char>::~allocator((allocator<char> *)&local_521);
    bVar1 = cfd::capi::IsEmptyString((char *)in_stack_00000008);
    if (bVar1) {
      bVar1 = cfd::capi::IsEmptyString((char *)local_38);
      WVar5 = (WitnessVersion)in_stack_fffffffffffff950;
      if (!bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_608,(char *)local_38,&local_609);
        cfd::core::Pubkey::Pubkey(&local_5e8,&local_608);
        cfd::core::SigHashType::SigHashType(&local_618,&local_198);
        local_1d2 = cfd::ConfidentialTransactionContext::VerifyInputSignature
                              (in_stack_fffffffffffff940,in_stack_fffffffffffff938,
                               in_stack_fffffffffffff930,in_stack_fffffffffffff928,
                               (SigHashType *)
                               CONCAT17(in_stack_fffffffffffff927,
                                        CONCAT16(in_stack_fffffffffffff926,in_stack_fffffffffffff920
                                                )),in_stack_fffffffffffff918,WVar5);
        cfd::core::Pubkey::~Pubkey((Pubkey *)0x61ce8e);
        std::__cxx11::string::~string((string *)&local_608);
        std::allocator<char>::~allocator((allocator<char> *)&local_609);
      }
    }
    else {
      paVar4 = &local_561;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_560,(char *)local_38,paVar4);
      cfd::core::Pubkey::Pubkey(&local_540,&local_560);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_5c0,(char *)in_stack_00000008,&local_5c1);
      cfd::core::Script::Script(&local_5a0,&local_5c0);
      cfd::core::SigHashType::SigHashType(&local_5d0,&local_198);
      in_stack_fffffffffffff880 = local_110;
      local_1d2 = cfd::ConfidentialTransactionContext::VerifyInputSignature
                            (in_stack_fffffffffffff940,in_stack_fffffffffffff938,
                             in_stack_fffffffffffff930,in_stack_fffffffffffff928,
                             (Script *)
                             CONCAT17(in_stack_fffffffffffff927,
                                      CONCAT16(in_stack_fffffffffffff926,in_stack_fffffffffffff920))
                             ,(SigHashType *)in_stack_fffffffffffff918,in_stack_fffffffffffff950,
                             in_stack_fffffffffffff958);
      cfd::core::Script::~Script
                ((Script *)CONCAT44(in_stack_fffffffffffff884,in_stack_fffffffffffff880));
      std::__cxx11::string::~string((string *)&local_5c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_5c1);
      cfd::core::Pubkey::~Pubkey((Pubkey *)0x61cc63);
      std::__cxx11::string::~string((string *)&local_560);
      std::allocator<char>::~allocator((allocator<char> *)&local_561);
    }
    cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
              ((ConfidentialTransactionContext *)
               CONCAT44(in_stack_fffffffffffff884,in_stack_fffffffffffff880));
    cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x61cf2f);
  }
  else {
    paVar4 = (allocator *)&local_2f1.utxo_map_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)
               ((long)&local_2f1.utxo_map_.
                       super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
                       super__Vector_impl_data._M_start + 1),(char *)local_20,paVar4);
    WVar5 = (WitnessVersion)paVar4;
    cfd::TransactionContext::TransactionContext
              ((TransactionContext *)CONCAT44(in_stack_fffffffffffff884,in_stack_fffffffffffff880),
               in_stack_fffffffffffff878);
    std::__cxx11::string::~string
              ((string *)
               ((long)&local_2f1.utxo_map_.
                       super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
                       super__Vector_impl_data._M_start + 1));
    std::allocator<char>::~allocator((allocator<char> *)&local_2f1.utxo_map_);
    bVar1 = cfd::capi::IsEmptyString((char *)in_stack_00000008);
    if (bVar1) {
      uVar2 = cfd::capi::IsEmptyString((char *)local_38);
      WVar5 = (WitnessVersion)local_20;
      if (!(bool)uVar2) {
        value_00 = local_399;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)((long)&local_399[0].amount_ + 1),(char *)local_38,
                   (allocator *)value_00);
        cfd::core::Pubkey::Pubkey(&local_378,(string *)((long)&local_399[0].amount_ + 1));
        cfd::core::SigHashType::SigHashType(&local_3a8,&local_198);
        local_1d2 = cfd::TransactionContext::VerifyInputSignature
                              ((TransactionContext *)in_stack_fffffffffffff940,
                               in_stack_fffffffffffff938,in_stack_fffffffffffff930,
                               in_stack_fffffffffffff928,
                               (SigHashType *)
                               CONCAT17(in_stack_fffffffffffff927,
                                        CONCAT16(uVar2,in_stack_fffffffffffff920)),value_00,WVar5);
        cfd::core::Pubkey::~Pubkey((Pubkey *)0x61c829);
        std::__cxx11::string::~string((string *)((long)&local_399[0].amount_ + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_399);
      }
    }
    else {
      this = &local_2f1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)
                 ((long)&local_2f1.super_Transaction.super_AbstractTransaction.
                         _vptr_AbstractTransaction + 1),(char *)local_38,(allocator *)this);
      cfd::core::Pubkey::Pubkey
                ((Pubkey *)
                 ((long)&local_2f1.super_Transaction.vin_.
                         super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 1),
                 (string *)
                 ((long)&local_2f1.super_Transaction.super_AbstractTransaction.
                         _vptr_AbstractTransaction + 1));
      paVar4 = &local_351;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_350,(char *)in_stack_00000008,paVar4);
      cfd::core::Script::Script(&local_330,&local_350);
      cfd::core::SigHashType::SigHashType(&local_360,&local_198);
      in_stack_fffffffffffff880 = local_110;
      local_1d2 = cfd::TransactionContext::VerifyInputSignature
                            (this,local_38,(Pubkey *)paVar4,in_stack_00000008,
                             (Script *)
                             CONCAT17(in_stack_fffffffffffff927,
                                      CONCAT16(in_stack_fffffffffffff926,in_stack_fffffffffffff920))
                             ,(SigHashType *)in_stack_fffffffffffff918,local_20,WVar5);
      cfd::core::Script::~Script
                ((Script *)CONCAT44(in_stack_fffffffffffff884,in_stack_fffffffffffff880));
      std::__cxx11::string::~string((string *)&local_350);
      std::allocator<char>::~allocator((allocator<char> *)&local_351);
      cfd::core::Pubkey::~Pubkey((Pubkey *)0x61c4ff);
      std::__cxx11::string::~string
                ((string *)
                 ((long)&local_2f1.super_Transaction.super_AbstractTransaction.
                         _vptr_AbstractTransaction + 1));
      std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
    }
    cfd::TransactionContext::~TransactionContext
              ((TransactionContext *)CONCAT44(in_stack_fffffffffffff884,in_stack_fffffffffffff880));
  }
  if ((local_1d2 & 1) == 0) {
    local_4 = 7;
  }
  else {
    local_4 = 0;
  }
  cfd::core::ByteData::~ByteData((ByteData *)0x61cf92);
  cfd::core::OutPoint::~OutPoint((OutPoint *)0x61cf9f);
  return local_4;
}

Assistant:

int CfdVerifySignature(
    void* handle, int net_type, const char* tx_hex, const char* signature,
    int hash_type, const char* pubkey, const char* script, const char* txid,
    uint32_t vout, int sighash_type, bool sighash_anyone_can_pay,
    int64_t value_satoshi, const char* value_bytedata) {
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }
    if (IsEmptyString(signature)) {
      warn(CFD_LOG_SOURCE, "signature is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. signature is null or empty.");
    }
    if (IsEmptyString(pubkey)) {
      warn(CFD_LOG_SOURCE, "pubkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pubkey is null or empty.");
    }

    WitnessVersion version = GetWitnessVersion(hash_type);
    Amount amount = Amount(value_satoshi);
    OutPoint outpoint(Txid(txid), vout);
    SigHashType sighashtype = SigHashType::Create(
        static_cast<uint8_t>(sighash_type), sighash_anyone_can_pay);
    ByteData signature_obj(signature);

    bool is_verify = false;
    bool is_bitcoin = false;
    ConvertNetType(net_type, &is_bitcoin);
    if (is_bitcoin) {
      TransactionContext tx(tx_hex);
      if (!IsEmptyString(script)) {
        is_verify = tx.VerifyInputSignature(
            signature_obj, Pubkey(pubkey), outpoint, Script(script),
            sighashtype, amount, version);
      } else if (!IsEmptyString(pubkey)) {
        is_verify = tx.VerifyInputSignature(
            signature_obj, Pubkey(pubkey), outpoint, sighashtype, amount,
            version);
      }
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialValue value;
      if (!IsEmptyString(value_bytedata)) {
        value = ConfidentialValue(value_bytedata);
      } else {
        value = ConfidentialValue(amount);
      }
      ConfidentialTransactionContext tx(tx_hex);
      if (!IsEmptyString(script)) {
        is_verify = tx.VerifyInputSignature(
            signature_obj, Pubkey(pubkey), outpoint, Script(script),
            sighashtype, value, version);
      } else if (!IsEmptyString(pubkey)) {
        is_verify = tx.VerifyInputSignature(
            signature_obj, Pubkey(pubkey), outpoint, sighashtype, value,
            version);
      }
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    if (!is_verify) {
      return CfdErrorCode::kCfdSignVerificationError;
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}